

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O1

Reals __thiscall Omega_h::get_nelems_per_elem(Omega_h *this,Mesh *mesh,Reals *v2m)

{
  int *piVar1;
  uint uVar2;
  Alloc *pAVar3;
  void *pvVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  double b;
  Read<double> RVar5;
  Reals RVar6;
  Reals complexity;
  Read<double> local_50;
  Reals local_40;
  Alloc *local_30;
  void *local_28;
  
  local_40.write_.shared_alloc_.alloc = (v2m->write_).shared_alloc_.alloc;
  if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40.write_.shared_alloc_.alloc =
           (Alloc *)((local_40.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_40.write_.shared_alloc_.alloc)->use_count =
           (local_40.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_40.write_.shared_alloc_.direct_ptr = (v2m->write_).shared_alloc_.direct_ptr;
  get_complexity_per_elem((Omega_h *)&local_30,mesh,&local_40);
  pAVar3 = local_40.write_.shared_alloc_.alloc;
  if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_40.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_50.write_.shared_alloc_.alloc = local_30;
  if (((ulong)local_30 & 7) == 0 && local_30 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50.write_.shared_alloc_.alloc = (Alloc *)(local_30->size * 8 + 1);
    }
    else {
      local_30->use_count = local_30->use_count + 1;
    }
  }
  local_50.write_.shared_alloc_.direct_ptr = local_28;
  uVar2 = mesh->dim_;
  if (uVar2 < 4) {
    if (uVar2 == 3) {
      b = 11.919887387328211;
    }
    else {
      b = *(double *)(&DAT_00457630 + (ulong)(uVar2 == 2) * 8);
    }
    RVar5 = multiply_each_by<double>(this,&local_50,b);
    pAVar3 = local_50.write_.shared_alloc_.alloc;
    pvVar4 = RVar5.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
        local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_50.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_50.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
        pvVar4 = extraout_RDX;
      }
    }
    if (((ulong)local_30 & 7) == 0 && local_30 != (Alloc *)0x0) {
      piVar1 = &local_30->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_30);
        operator_delete(local_30,0x48);
        pvVar4 = extraout_RDX_00;
      }
    }
    RVar6.write_.shared_alloc_.direct_ptr = pvVar4;
    RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Reals)RVar6.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

Reals get_nelems_per_elem(Mesh* mesh, Reals v2m) {
  auto complexity = get_complexity_per_elem(mesh, v2m);
  return multiply_each_by(
      complexity, 1.0 / typical_unit_simplex_size(mesh->dim()));
}